

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Close(sqlite3 *db,int forceZombie)

{
  int iVar1;
  int forceZombie_local;
  sqlite3 *db_local;
  
  if (db == (sqlite3 *)0x0) {
    db_local._4_4_ = 0;
  }
  else {
    iVar1 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar1 == 0) {
      db_local._4_4_ = sqlite3MisuseError(0x1c396);
    }
    else {
      sqlite3_mutex_enter(db->mutex);
      disconnectAllVtab(db);
      sqlite3VtabRollback(db);
      if ((forceZombie == 0) && (iVar1 = connectionIsBusy(db), iVar1 != 0)) {
        sqlite3Error(db,5,"unable to close due to unfinalized statements or unfinished backups");
        sqlite3_mutex_leave(db->mutex);
        return 5;
      }
      db->magic = 0x64cffc7f;
      sqlite3LeaveMutexAndCloseZombie(db);
      db_local._4_4_ = 0;
    }
  }
  return db_local._4_4_;
}

Assistant:

static int sqlite3Close(sqlite3 *db, int forceZombie){
  if( !db ){
    return SQLITE_OK;
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);

  /* Force xDisconnect calls on all virtual tables */
  disconnectAllVtab(db);

  /* If a transaction is open, the disconnectAllVtab() call above
  ** will not have called the xDisconnect() method on any virtual
  ** tables in the db->aVTrans[] array. The following sqlite3VtabRollback()
  ** call will do so. We need to do this before the check for active
  ** SQL statements below, as the v-table implementation may be storing
  ** some prepared statements internally.
  */
  sqlite3VtabRollback(db);

  /* Legacy behavior (sqlite3_close() behavior) is to return
  ** SQLITE_BUSY if the connection can not be closed immediately.
  */
  if( !forceZombie && connectionIsBusy(db) ){
    sqlite3Error(db, SQLITE_BUSY, "unable to close due to unfinalized "
       "statements or unfinished backups");
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_BUSY;
  }

#ifdef SQLITE_ENABLE_SQLLOG
  if( sqlite3GlobalConfig.xSqllog ){
    /* Closing the handle. Fourth parameter is passed the value 2. */
    sqlite3GlobalConfig.xSqllog(sqlite3GlobalConfig.pSqllogArg, db, 0, 2);
  }
#endif

  /* Convert the connection into a zombie and then close it.
  */
  db->magic = SQLITE_MAGIC_ZOMBIE;
  sqlite3LeaveMutexAndCloseZombie(db);
  return SQLITE_OK;
}